

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_visuals.cxx
# Opt level: O2

void __thiscall xray_re::xr_visual_object::~xr_visual_object(xr_visual_object *this)

{
  (this->super_xr_custom_object)._vptr_xr_custom_object =
       (_func_int **)&PTR__xr_visual_object_0023a178;
  std::__cxx11::string::~string((string *)&this->m_reference);
  xr_custom_object::~xr_custom_object(&this->super_xr_custom_object);
  return;
}

Assistant:

xr_visual_object::~xr_visual_object() {}